

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tasn_dec.cc
# Opt level: O0

int asn1_template_ex_d2i
              (ASN1_VALUE **val,uchar **in,long inlen,ASN1_TEMPLATE *tt,char opt,CRYPTO_BUFFER *buf,
              int depth)

{
  char local_65;
  uint local_64;
  char cst;
  uchar *puStack_60;
  uint32_t flags;
  uchar *q;
  uchar *p;
  long len;
  int ret;
  int aclass;
  CRYPTO_BUFFER *buf_local;
  ASN1_TEMPLATE *pAStack_30;
  char opt_local;
  ASN1_TEMPLATE *tt_local;
  long inlen_local;
  uchar **in_local;
  ASN1_VALUE **val_local;
  
  if (val == (ASN1_VALUE **)0x0) {
    val_local._4_4_ = 0;
  }
  else {
    local_64 = tt->flags;
    len._4_4_ = local_64 & 0xc0;
    q = *in;
    _ret = buf;
    buf_local._7_1_ = opt;
    pAStack_30 = (ASN1_TEMPLATE *)tt;
    tt_local = (ASN1_TEMPLATE *)inlen;
    inlen_local = (long)in;
    in_local = (uchar **)val;
    if ((local_64 & 0x10) == 0) {
      val_local._4_4_ = asn1_template_noexp_d2i(val,in,inlen,tt,opt,buf,depth);
    }
    else {
      len._0_4_ = asn1_check_tlen((long *)&p,(int *)0x0,(uchar *)0x0,&local_65,&q,inlen,tt->tag,
                                  len._4_4_,opt);
      puStack_60 = q;
      if ((int)len == 0) {
        ERR_put_error(0xc,0,0x9e,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x1e1);
        val_local._4_4_ = 0;
      }
      else if ((int)len == -1) {
        val_local._4_4_ = -1;
      }
      else if (local_65 == '\0') {
        ERR_put_error(0xc,0,0x78,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                      ,0x1e7);
        val_local._4_4_ = 0;
      }
      else {
        len._0_4_ = asn1_template_noexp_d2i
                              ((ASN1_VALUE **)in_local,&q,(long)p,(ASN1_TEMPLATE *)pAStack_30,'\0',
                               _ret,depth);
        if ((int)len == 0) {
          ERR_put_error(0xc,0,0x9e,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                        ,0x1ed);
          val_local._4_4_ = 0;
        }
        else {
          p = p + -((long)q - (long)puStack_60);
          if (p == (uchar *)0x0) {
            *(uchar **)inlen_local = q;
            val_local._4_4_ = 1;
          }
          else {
            ERR_put_error(0xc,0,0x77,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/asn1/tasn_dec.cc"
                          ,500);
            ASN1_template_free((ASN1_VALUE **)in_local,pAStack_30);
            val_local._4_4_ = 0;
          }
        }
      }
    }
  }
  return val_local._4_4_;
}

Assistant:

static int asn1_template_ex_d2i(ASN1_VALUE **val, const unsigned char **in,
                                long inlen, const ASN1_TEMPLATE *tt, char opt,
                                CRYPTO_BUFFER *buf, int depth) {
  int aclass;
  int ret;
  long len;
  const unsigned char *p, *q;
  if (!val) {
    return 0;
  }
  uint32_t flags = tt->flags;
  aclass = flags & ASN1_TFLG_TAG_CLASS;

  p = *in;

  // Check if EXPLICIT tag expected
  if (flags & ASN1_TFLG_EXPTAG) {
    char cst;
    // Need to work out amount of data available to the inner content and
    // where it starts: so read in EXPLICIT header to get the info.
    ret = asn1_check_tlen(&len, NULL, NULL, &cst, &p, inlen, tt->tag, aclass,
                          opt);
    q = p;
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    } else if (ret == -1) {
      return -1;
    }
    if (!cst) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_TAG_NOT_CONSTRUCTED);
      return 0;
    }
    // We've found the field so it can't be OPTIONAL now
    ret = asn1_template_noexp_d2i(val, &p, len, tt, /*opt=*/0, buf, depth);
    if (!ret) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_NESTED_ASN1_ERROR);
      return 0;
    }
    // We read the field in OK so update length
    len -= p - q;
    // Check for trailing data.
    if (len) {
      OPENSSL_PUT_ERROR(ASN1, ASN1_R_EXPLICIT_LENGTH_MISMATCH);
      goto err;
    }
  } else {
    return asn1_template_noexp_d2i(val, in, inlen, tt, opt, buf, depth);
  }

  *in = p;
  return 1;

err:
  ASN1_template_free(val, tt);
  return 0;
}